

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFunctionDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
ValueFunctionDecPOMDPDiscrete::SetCached
          (ValueFunctionDecPOMDPDiscrete *this,Index sI,Index JOHI,double val)

{
  mapped_type *pmVar1;
  Index in_EDX;
  Index in_ESI;
  ValueFunctionDecPOMDPDiscrete *in_RDI;
  mapped_type in_XMM0_Qa;
  key_type_conflict *in_stack_ffffffffffffffc8;
  CacheType *this_00;
  
  this_00 = &in_RDI->_m_cache;
  GetCombinedIndex(in_RDI,in_ESI,in_EDX);
  pmVar1 = boost::unordered::
           unordered_map<unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
           ::operator[](this_00,in_stack_ffffffffffffffc8);
  *pmVar1 = in_XMM0_Qa;
  return;
}

Assistant:

void ValueFunctionDecPOMDPDiscrete::SetCached(Index sI, Index JOHI, double val)
{
    _m_cache[GetCombinedIndex(sI, JOHI)]=val;
}